

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::~cmLocalGenerator(cmLocalGenerator *this)

{
  cmLocalGenerator *this_local;
  
  ~cmLocalGenerator(this);
  operator_delete(this,0x198);
  return;
}

Assistant:

cmLocalGenerator::~cmLocalGenerator()
{
  cmDeleteAll(this->GeneratorTargets);
  cmDeleteAll(this->OwnedImportedGeneratorTargets);
}